

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Int_t * Acec_RankTrees(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vXorRoots)

{
  int iVar1;
  uint Entry_00;
  uint i_00;
  uint uVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int Node;
  int Rank;
  int Root;
  Vec_Int_t *vRanks;
  int local_30;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vDoubles;
  Vec_Int_t *vXorRoots_local;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStartFull(iVar1);
  for (Entry = 0; iVar1 = Vec_IntSize(vXorRoots), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(vXorRoots,Entry);
    Vec_IntWriteEntry(p_01,iVar1,Entry);
  }
  iVar1 = Vec_IntSize(vXors);
  Entry = iVar1 / 4;
  while (Entry = Entry + -1, -1 < Entry) {
    iVar1 = Vec_IntEntry(vXors,Entry * 4);
    Entry_00 = Vec_IntEntry(p_01,iVar1);
    if (Entry_00 != 0xffffffff) {
      for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
        i_00 = Vec_IntEntry(vXors,Entry * 4 + local_30);
        if ((i_00 != 0) && (uVar2 = Vec_IntEntry(p_01,i_00), uVar2 != Entry_00)) {
          if (uVar2 == 0xffffffff) {
            Vec_IntWriteEntry(p_01,i_00,Entry_00);
          }
          else {
            Vec_IntPush(p_00,i_00);
            pObj = Gia_ManObj(p,i_00);
            iVar1 = Gia_ObjIsAnd(pObj);
            if (iVar1 != 0) {
              printf("Xor node %d belongs to Tree %d and Tree %d.\n",(ulong)i_00,(ulong)uVar2,
                     (ulong)Entry_00);
            }
          }
        }
      }
    }
  }
  for (Entry = 0; iVar1 = Vec_IntSize(p_00), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p_00,Entry);
    Vec_IntWriteEntry(p_01,iVar1,-1);
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Acec_RankTrees( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vXorRoots )
{
    Vec_Int_t * vDoubles = Vec_IntAlloc( 100 );
    int i, k, Entry;
    // map roots into their ranks
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) ); 
    Vec_IntForEachEntry( vXorRoots, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, i );
    // map nodes into their ranks
    for ( i = Vec_IntSize(vXors)/4 - 1; i >= 0; i-- )
    {
        int Root = Vec_IntEntry( vXors, 4*i );
        int Rank = Vec_IntEntry( vRanks, Root );
        // skip XORs that are not part of any tree
        if ( Rank == -1 )
            continue;
        // iterate through XOR inputs
        for ( k = 1; k < 4; k++ )
        {
            int Node = Vec_IntEntry( vXors, 4*i+k );
            if ( Node == 0 ) // HA
                continue;
            Entry = Vec_IntEntry( vRanks, Node );
            if ( Entry == Rank ) // the same tree
                continue;
            if ( Entry == -1 )
                Vec_IntWriteEntry( vRanks, Node, Rank );
            else
                Vec_IntPush( vDoubles, Node );

            if ( Entry != -1 && Gia_ObjIsAnd(Gia_ManObj(p, Node)))
            printf( "Xor node %d belongs to Tree %d and Tree %d.\n", Node, Entry, Rank );
        }
    }
    // remove duplicated entries
    Vec_IntForEachEntry( vDoubles, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, -1 );
    Vec_IntFree( vDoubles );
    return vRanks;
}